

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

reference __thiscall
QVLABase<QWizard::WizardButton>::emplace_back_impl<QWizard::WizardButton_const&>
          (QVLABase<QWizard::WizardButton> *this,qsizetype prealloc,void *array,WizardButton *args)

{
  reference pvVar1;
  long asize;
  long aalloc;
  
  asize = (this->super_QVLABaseBase).s;
  if (asize == (this->super_QVLABaseBase).a) {
    aalloc = asize + 1;
    if (asize + 1 < asize * 2) {
      aalloc = asize * 2;
    }
    reallocate_impl(this,prealloc,array,asize,aalloc);
    asize = (this->super_QVLABaseBase).s;
  }
  pvVar1 = (reference)((long)(this->super_QVLABaseBase).ptr + asize * 4);
  *pvVar1 = *args;
  (this->super_QVLABaseBase).s = asize + 1;
  return pvVar1;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }